

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

type * __thiscall
linalg::detail::apply<linalg::detail::op_div,void,linalg::mat<double,3,3>,double>::impl<0,1,2>
          (double param_1,type *__return_storage_ptr__,
          apply<linalg::detail::op_div,void,linalg::mat<double,3,3>,double> *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  dVar1 = *(double *)(this + 0x40);
  auVar5._8_8_ = param_1;
  auVar5._0_8_ = param_1;
  auVar5 = divpd(*(undefined1 (*) [16])this,auVar5);
  (__return_storage_ptr__->x).x = (double)auVar5._0_8_;
  (__return_storage_ptr__->x).y = (double)auVar5._8_8_;
  auVar2._8_8_ = param_1;
  auVar2._0_8_ = param_1;
  auVar5 = divpd(*(undefined1 (*) [16])(this + 0x10),auVar2);
  *(undefined1 (*) [16])&(__return_storage_ptr__->x).z = auVar5;
  auVar3._8_8_ = param_1;
  auVar3._0_8_ = param_1;
  auVar5 = divpd(*(undefined1 (*) [16])(this + 0x20),auVar3);
  (__return_storage_ptr__->y).y = (double)auVar5._0_8_;
  (__return_storage_ptr__->y).z = (double)auVar5._8_8_;
  auVar4._8_8_ = param_1;
  auVar4._0_8_ = param_1;
  auVar5 = divpd(*(undefined1 (*) [16])(this + 0x30),auVar4);
  (__return_storage_ptr__->z).x = (double)auVar5._0_8_;
  (__return_storage_ptr__->z).y = (double)auVar5._8_8_;
  (__return_storage_ptr__->z).z = dVar1 / param_1;
  return __return_storage_ptr__;
}

Assistant:

static constexpr type impl(seq<J...>, F f, const mat<A,M,N> & a, B                  b) { return {apply<F, void, vec<A,M>, B       >::impl(make_seq<0,M>{}, f, getter<J>{}(a), b             )...}; }